

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::eval_divide_knuth
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,
          uintwide_t<256U,_unsigned_short,_void,_true> *other,
          uintwide_t<256U,_unsigned_short,_void,_true> *remainder)

{
  value_type_conflict3 vVar1;
  value_type_conflict3 vVar2;
  ushort uVar3;
  ushort uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  representation_type *prVar8;
  long lVar9;
  unsigned_fast_type v_offset;
  unsigned_fast_type u_offset;
  
  lVar9 = 0x20;
  u_offset = 0;
  do {
    if (*(short *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9 + -2) != 0)
    goto LAB_00127351;
    u_offset = u_offset + 1;
    lVar9 = lVar9 + -2;
  } while (lVar9 != 0);
  u_offset = 0x10;
LAB_00127351:
  lVar9 = 0x20;
  v_offset = 0;
  while (*(short *)((long)(other->values).super_array<unsigned_short,_16UL>.elems + lVar9 + -2) == 0
        ) {
    v_offset = v_offset + 1;
    lVar9 = lVar9 + -2;
    if (lVar9 == 0) goto LAB_001273b3;
  }
  if (lVar9 == 0) goto LAB_001273b3;
  if (u_offset == 0x10) goto joined_r0x001273c9;
  vVar1 = (other->values).super_array<unsigned_short,_16UL>.elems[0xf];
  vVar2 = (this->values).super_array<unsigned_short,_16UL>.elems[0xf];
  if (-1 < (short)vVar1 && (short)vVar2 < 0) goto LAB_00127393;
  if ((short)vVar1 < 0 && -1 < (short)vVar2) goto LAB_0012740e;
  lVar9 = 0x1e;
  while (lVar9 != -2) {
    uVar3 = *(ushort *)((long)(other->values).super_array<unsigned_short,_16UL>.elems + lVar9);
    uVar4 = *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9);
    lVar9 = lVar9 + -2;
    if (uVar4 != uVar3) {
      if (uVar4 <= uVar3) {
LAB_00127393:
        if (remainder != (uintwide_t<256U,_unsigned_short,_void,_true> *)0x0) {
          uVar5 = *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems;
          uVar6 = *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4);
          uVar7 = *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc);
          *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 8) =
               *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8);
          *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uVar7
          ;
          *(undefined8 *)(remainder->values).super_array<unsigned_short,_16UL>.elems = uVar5;
          *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 4) = uVar6;
        }
        prVar8 = &this->values;
        (prVar8->super_array<unsigned_short,_16UL>).elems[8] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[9] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[10] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[0xb] = 0;
        prVar8 = &this->values;
        (prVar8->super_array<unsigned_short,_16UL>).elems[0xc] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[0xd] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[0xe] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[0xf] = 0;
        (this->values).super_array<unsigned_short,_16UL>.elems[0] = 0;
        (this->values).super_array<unsigned_short,_16UL>.elems[1] = 0;
        (this->values).super_array<unsigned_short,_16UL>.elems[2] = 0;
        (this->values).super_array<unsigned_short,_16UL>.elems[3] = 0;
        prVar8 = &this->values;
        (prVar8->super_array<unsigned_short,_16UL>).elems[4] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[5] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[6] = 0;
        (prVar8->super_array<unsigned_short,_16UL>).elems[7] = 0;
        return;
      }
LAB_0012740e:
      void_math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::
      eval_divide_knuth_core<256u>(unsigned_long,unsigned_long,math::wide_integer::
      uintwide_t<256u,unsigned_short,void,true>const&,math::wide_integer::
      uintwide_t<256u,unsigned_short,void,true>*,std::
      enable_if<((256u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_short>::
      digits))),int>::type__
                (this,u_offset,v_offset,other,remainder,
                 (enable_if_t<(256U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                  *)0x0);
      return;
    }
  }
  (this->values).super_array<unsigned_short,_16UL>.elems[0] = 1;
  prVar8 = &this->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[1] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[2] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[3] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[4] = 0;
  prVar8 = &this->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[5] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[6] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[7] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[8] = 0;
  prVar8 = &this->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[8] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[9] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[10] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xb] = 0;
  prVar8 = &this->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xc] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xd] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xe] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xf] = 0;
joined_r0x001273c9:
  if (remainder == (uintwide_t<256U,_unsigned_short,_void,_true> *)0x0) {
    return;
  }
  prVar8 = &remainder->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[8] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[9] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[10] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xb] = 0;
  prVar8 = &remainder->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xc] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xd] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xe] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[0xf] = 0;
  (remainder->values).super_array<unsigned_short,_16UL>.elems[0] = 0;
  (remainder->values).super_array<unsigned_short,_16UL>.elems[1] = 0;
  (remainder->values).super_array<unsigned_short,_16UL>.elems[2] = 0;
  (remainder->values).super_array<unsigned_short,_16UL>.elems[3] = 0;
  prVar8 = &remainder->values;
  (prVar8->super_array<unsigned_short,_16UL>).elems[4] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[5] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[6] = 0;
  (prVar8->super_array<unsigned_short,_16UL>).elems[7] = 0;
  return;
LAB_001273b3:
  (this->values).super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  (this->values).super_array<unsigned_short,_16UL>.elems[0xf] = 0x7fff;
  goto joined_r0x001273c9;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }